

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

char * cppcms_capi_error_clear(cppcms_capi_object obj)

{
  char *pcVar1;
  
  if (obj != (cppcms_capi_object)0x0) {
    if (*obj == 0) {
      pcVar1 = "ok";
    }
    else {
      pcVar1 = *(char **)((long)obj + 8);
    }
    *(undefined4 *)obj = 0;
    return pcVar1;
  }
  return "ok";
}

Assistant:

char const *cppcms_capi_error_clear(cppcms_capi_object obj)
{
	char const *r=cppcms_capi_error_message(obj);
	if(obj) {
		static_cast<cppcms_capi_exception *>(obj)->code = 0;
	}
	return r;
}